

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O0

Lf_Man_t * Lf_ManAlloc(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  int iVar1;
  Lf_Man_t *pLVar2;
  abctime aVar3;
  Lf_Bst_t *pLVar4;
  Gia_Obj_t *pGVar5;
  Vec_Mem_t *local_30;
  int local_28;
  int local_24;
  int k;
  int i;
  Lf_Man_t *p;
  Jf_Par_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  local_28 = 0;
  if ((pPars->nCutNum < 2) || (0x20 < pPars->nCutNum)) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= LF_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x76d,"Lf_Man_t *Lf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
  }
  if ((1 < pPars->nLutSize) && (pPars->nLutSize < 0xd)) {
    if (pGia->pRefs != (int *)0x0) {
      free(pGia->pRefs);
      pGia->pRefs = (int *)0x0;
    }
    Vec_IntFreeP(&pGia->vMapping);
    Gia_ManCleanValue(pGia);
    iVar1 = Gia_ManHasChoices(pGia);
    if (iVar1 != 0) {
      Gia_ManSetPhase(pGia);
    }
    pLVar2 = (Lf_Man_t *)calloc(1,0x1a0);
    Lf_ManAnalyzeCoDrivers(pGia,&pLVar2->nCoDrivers,&pLVar2->nInverters);
    if (pPars->fPower != 0) {
      Lf_ManComputeSwitching(pGia,&pLVar2->vSwitches);
    }
    aVar3 = Abc_Clock();
    pLVar2->clkStart = aVar3;
    pLVar2->pGia = pGia;
    pLVar2->pPars = pPars;
    pLVar2->nCutWords = (int)((long)pPars->nLutSize + 7U >> 1);
    pLVar2->nSetWords = pLVar2->nCutWords * pPars->nCutNum;
    if (pPars->fCutMin == 0) {
      local_30 = (Vec_Mem_t *)0x0;
    }
    else {
      local_30 = Vec_MemAllocForTT(pPars->nLutSize,0);
    }
    pLVar2->vTtMem = local_30;
    if ((pPars->fCutMin != 0) && (pPars->fUseMux7 != 0)) {
      Vec_MemAddMuxTT(pLVar2->vTtMem,pPars->nLutSize);
    }
    iVar1 = Gia_ManAndNotBufNum(pGia);
    pLVar4 = (Lf_Bst_t *)calloc((long)iVar1,0x20);
    pLVar2->pObjBests = pLVar4;
    Vec_IntGrow(&pLVar2->vFreeSets,0x4000);
    Vec_PtrGrow(&pLVar2->vFreePages,0x100);
    Lf_MemAlloc(&pLVar2->vStoreOld,0x10,&pLVar2->vFreePages,pLVar2->nCutWords);
    Lf_MemAlloc(&pLVar2->vStoreNew,0x10,&pLVar2->vFreePages,pLVar2->nCutWords);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFill(&pLVar2->vOffsets,iVar1,-1);
    iVar1 = Gia_ManObjNum(pGia);
    Vec_IntFill(&pLVar2->vRequired,iVar1,1000000000);
    iVar1 = Gia_ManAndNotBufNum(pGia);
    Vec_IntFill(&pLVar2->vCutSets,iVar1,-1);
    iVar1 = Gia_ManAndNotBufNum(pGia);
    Vec_FltFill(&pLVar2->vFlowRefs,iVar1,0.0);
    iVar1 = Gia_ManAndNotBufNum(pGia);
    Vec_IntFill(&pLVar2->vMapRefs,iVar1,0);
    iVar1 = Gia_ManCiNum(pGia);
    Vec_IntFill(&pLVar2->vCiArrivals,iVar1,0);
    for (local_24 = 0; local_24 < pGia->nObjs; local_24 = local_24 + 1) {
      pGVar5 = Gia_ManObj(pGia,local_24);
      iVar1 = Gia_ObjIsAnd(pGVar5);
      if (iVar1 != 0) {
        pGVar5 = Gia_ManObj(pGia,local_24);
        iVar1 = Gia_ObjIsBuf(pGVar5);
        if (iVar1 == 0) {
          Vec_IntWriteEntry(&pLVar2->vOffsets,local_24,local_28);
          local_28 = local_28 + 1;
        }
      }
    }
    iVar1 = Gia_ManAndNotBufNum(pGia);
    if (local_28 != iVar1) {
      __assert_fail("k == Gia_ManAndNotBufNum(pGia)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                    ,0x78e,"Lf_Man_t *Lf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
    }
    Lf_ManSetFlowRefs(pGia,&pLVar2->vFlowRefs,&pLVar2->vOffsets);
    if (pPars->pTimesArr != (float *)0x0) {
      for (local_24 = 0; iVar1 = Gia_ManPiNum(pGia), local_24 < iVar1; local_24 = local_24 + 1) {
        Vec_IntWriteEntry(&pLVar2->vCiArrivals,local_24,(int)pPars->pTimesArr[local_24]);
      }
    }
    return pLVar2;
  }
  __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= LF_LEAF_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                ,0x76e,"Lf_Man_t *Lf_ManAlloc(Gia_Man_t *, Jf_Par_t *)");
}

Assistant:

Lf_Man_t * Lf_ManAlloc( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Lf_Man_t * p; int i, k = 0;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= LF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= LF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vMapping );
    Gia_ManCleanValue( pGia );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    p = ABC_CALLOC( Lf_Man_t, 1 );
    Lf_ManAnalyzeCoDrivers( pGia, &p->nCoDrivers, &p->nInverters );
    if ( pPars->fPower )
        Lf_ManComputeSwitching( pGia, &p->vSwitches );
    p->clkStart  = Abc_Clock();
    p->pGia      = pGia;
    p->pPars     = pPars;
    p->nCutWords = (sizeof(Lf_Cut_t)/sizeof(int) + pPars->nLutSize + 1) >> 1;
    p->nSetWords = p->nCutWords * pPars->nCutNum;
    p->vTtMem    = pPars->fCutMin ? Vec_MemAllocForTT( pPars->nLutSize, 0 ) : NULL;
    if ( pPars->fCutMin && pPars->fUseMux7 )
        Vec_MemAddMuxTT( p->vTtMem, pPars->nLutSize );
    p->pObjBests = ABC_CALLOC( Lf_Bst_t, Gia_ManAndNotBufNum(pGia) );
    Vec_IntGrow( &p->vFreeSets, (1<<14) );
    Vec_PtrGrow( &p->vFreePages, 256 );
    Lf_MemAlloc( &p->vStoreOld, 16, &p->vFreePages, p->nCutWords );
    Lf_MemAlloc( &p->vStoreNew, 16, &p->vFreePages, p->nCutWords );
    Vec_IntFill( &p->vOffsets,  Gia_ManObjNum(pGia), -1 );
    Vec_IntFill( &p->vRequired, Gia_ManObjNum(pGia), ABC_INFINITY );
    Vec_IntFill( &p->vCutSets,  Gia_ManAndNotBufNum(pGia), -1 );
    Vec_FltFill( &p->vFlowRefs, Gia_ManAndNotBufNum(pGia), 0 );
    Vec_IntFill( &p->vMapRefs,  Gia_ManAndNotBufNum(pGia), 0 );
    Vec_IntFill( &p->vCiArrivals, Gia_ManCiNum(pGia), 0 );
    Gia_ManForEachAndId( pGia, i )
        if ( !Gia_ObjIsBuf(Gia_ManObj(pGia, i)) )
            Vec_IntWriteEntry( &p->vOffsets, i, k++ );
    assert( k == Gia_ManAndNotBufNum(pGia) );
    Lf_ManSetFlowRefs( pGia, &p->vFlowRefs, &p->vOffsets );
    if ( pPars->pTimesArr )
        for ( i = 0; i < Gia_ManPiNum(pGia); i++ )
            Vec_IntWriteEntry( &p->vCiArrivals, i, pPars->pTimesArr[i] );
    return p;
}